

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_distance.cpp
# Opt level: O1

long duckdb::ListCosineSimilarityFun::GetFunctions(void)

{
  BaseScalarFunction *pBVar1;
  NotImplementedException *this;
  ScalarFunction *func;
  BaseScalarFunction *function;
  long in_RDI;
  long lVar2;
  pointer pLVar3;
  initializer_list<duckdb::LogicalType> __l;
  initializer_list<duckdb::LogicalType> __l_00;
  LogicalType list;
  allocator_type local_451;
  long local_450;
  undefined1 local_448 [16];
  undefined1 local_438 [24];
  undefined **local_420;
  vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *local_418;
  undefined1 local_410 [48];
  _Any_data *local_3e0;
  _Any_data *local_3d8;
  LogicalType *local_3d0;
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_3c8;
  undefined1 *local_3b0 [2];
  undefined1 local_3a0 [16];
  LogicalType local_390 [24];
  LogicalType local_378 [24];
  vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> local_360;
  LogicalType local_348 [24];
  ScalarFunction local_330;
  ScalarFunction local_208;
  BaseScalarFunction local_e0 [176];
  
  local_3b0[0] = local_3a0;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_3b0,"list_cosine_similarity","");
  duckdb::ScalarFunctionSet::ScalarFunctionSet();
  if (local_3b0[0] != local_3a0) {
    operator_delete(local_3b0[0]);
  }
  local_450 = in_RDI;
  duckdb::LogicalType::Real();
  local_3d0 = local_3c8.
              super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
              super__Vector_impl_data._M_finish;
  if (local_3c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_start !=
      local_3c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    local_418 = (vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_> *)
                (local_450 + 0x20);
    local_3e0 = (_Any_data *)((long)&local_330 + 0xb0);
    local_3d8 = (_Any_data *)((long)&local_208 + 0xb0);
    local_420 = &PTR__ScalarFunction_008984e0;
    pLVar3 = local_3c8.super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      duckdb::LogicalType::LIST(local_348);
      if (*pLVar3 == (LogicalType)0x17) {
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,local_348);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_410 + 0x18),local_348);
        __l_00._M_len = 2;
        __l_00._M_array = (iterator)local_410;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_360,__l_00,&local_451);
        duckdb::LogicalType::LogicalType(local_378,pLVar3);
        local_448._8_8_ = 0;
        local_448._0_8_ = ListGenericFold<double,duckdb::CosineSimilarityOp>;
        local_438._8_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_438._0_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        duckdb::LogicalType::LogicalType(local_390,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  (&local_330,&local_360,local_378,local_448,0,0,0,0,local_390,0,0,0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_418,&local_330);
        local_330._0_8_ = local_420;
        if (local_330.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_330.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_330.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_330.function.super__Function_base._M_manager)
                    (local_3e0,local_3e0,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction(&local_330.super_BaseScalarFunction);
        duckdb::LogicalType::~LogicalType(local_390);
        if ((code *)local_438._0_8_ != (code *)0x0) {
          (*(code *)local_438._0_8_)(local_448,local_448,3);
        }
        duckdb::LogicalType::~LogicalType(local_378);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_360);
        lVar2 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_410 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      else {
        if (*pLVar3 != (LogicalType)0x16) {
          this = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_410._0_8_ = local_410 + 0x10;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_410,"List function not implemented for type %s","");
          duckdb::LogicalType::ToString_abi_cxx11_();
          NotImplementedException::NotImplementedException<std::__cxx11::string>
                    (this,(string *)local_410,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_448)
          ;
          __cxa_throw(this,&NotImplementedException::typeinfo,std::runtime_error::~runtime_error);
        }
        duckdb::LogicalType::LogicalType((LogicalType *)local_410,local_348);
        duckdb::LogicalType::LogicalType((LogicalType *)(local_410 + 0x18),local_348);
        __l._M_len = 2;
        __l._M_array = (iterator)local_410;
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
                  (&local_360,__l,&local_451);
        duckdb::LogicalType::LogicalType(local_378,pLVar3);
        local_448._8_8_ = 0;
        local_448._0_8_ = ListGenericFold<float,duckdb::CosineSimilarityOp>;
        local_438._8_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_invoke;
        local_438._0_8_ =
             std::
             _Function_handler<void_(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&),_void_(*)(duckdb::DataChunk_&,_duckdb::ExpressionState_&,_duckdb::Vector_&)>
             ::_M_manager;
        duckdb::LogicalType::LogicalType(local_390,INVALID);
        duckdb::ScalarFunction::ScalarFunction
                  (&local_208,&local_360,local_378,local_448,0,0,0,0,local_390,0,0,0);
        std::vector<duckdb::ScalarFunction,_std::allocator<duckdb::ScalarFunction>_>::
        emplace_back<duckdb::ScalarFunction>(local_418,&local_208);
        local_208._0_8_ = local_420;
        if (local_208.function_info.internal.
            super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
            _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    (local_208.function_info.internal.
                     super___shared_ptr<duckdb::ScalarFunctionInfo,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi);
        }
        if (local_208.function.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_208.function.super__Function_base._M_manager)
                    (local_3d8,local_3d8,__destroy_functor);
        }
        duckdb::BaseScalarFunction::~BaseScalarFunction(&local_208.super_BaseScalarFunction);
        duckdb::LogicalType::~LogicalType(local_390);
        if ((code *)local_438._0_8_ != (code *)0x0) {
          (*(code *)local_438._0_8_)(local_448,local_448,3);
        }
        duckdb::LogicalType::~LogicalType(local_378);
        std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_360);
        lVar2 = 0x18;
        do {
          duckdb::LogicalType::~LogicalType((LogicalType *)(local_410 + lVar2));
          lVar2 = lVar2 + -0x18;
        } while (lVar2 != -0x18);
      }
      duckdb::LogicalType::~LogicalType(local_348);
      pLVar3 = pLVar3 + 0x18;
    } while (pLVar3 != local_3d0);
  }
  std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector(&local_3c8);
  function = *(BaseScalarFunction **)(local_450 + 0x20);
  pBVar1 = *(BaseScalarFunction **)(local_450 + 0x28);
  if (function != pBVar1) {
    do {
      BaseScalarFunction::SetReturnsError(local_e0,function);
      duckdb::BaseScalarFunction::~BaseScalarFunction(local_e0);
      function = function + 0x128;
    } while (function != pBVar1);
  }
  return local_450;
}

Assistant:

ScalarFunctionSet ListCosineSimilarityFun::GetFunctions() {
	ScalarFunctionSet set("list_cosine_similarity");
	for (auto &type : LogicalType::Real()) {
		AddListFoldFunction<CosineSimilarityOp>(set, type);
	}
	for (auto &func : set.functions) {
		BaseScalarFunction::SetReturnsError(func);
	}
	return set;
}